

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

ssize_t __thiscall Reader::read(Reader *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer *ppGVar1;
  pointer *ppAVar2;
  byte bVar3;
  pointer pcVar4;
  iterator __position;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  void *pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pGVar11;
  uint uVar12;
  undefined4 in_register_00000034;
  iterator __position_00;
  int iVar13;
  ulong uVar14;
  int iVar15;
  pointer __pos;
  long lVar16;
  ulong uVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<Ant,_std::allocator<Ant>_> *local_40;
  vector<Pheromone,_std::allocator<Pheromone>_> *local_38;
  
  pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44(in_register_00000034,__fd);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uVar14 = 0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  pGVar11 = (pointer)pbVar8->_M_string_length;
  __pos = (pointer)0x0;
  if (pGVar11 != (pointer)0x0) {
    __pos = (pointer)0x0;
    local_80 = pbVar8;
    do {
      pbVar8 = local_80;
      uVar12 = (uint)uVar14;
      pcVar4 = (local_80->_M_dataplus)._M_p;
      pvVar7 = memchr((pointer)((long)&__pos->x + (long)pcVar4),10,(long)pGVar11 - (long)__pos);
      lVar16 = (long)pvVar7 - (long)pcVar4;
      if (lVar16 == -1 || pvVar7 == (void *)0x0) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_a0,pbVar8,(size_type)__pos,lVar16 - (long)__pos);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator=(&local_60,&local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,pbVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p) !=
          &local_a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p),
                        CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                 local_a0.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((int)uVar12 <= (int)local_60._M_string_length) {
        uVar14 = local_60._M_string_length & 0xffffffff;
      }
      uVar12 = (uint)uVar14;
      __pos = (pointer)(lVar16 + 1);
      pGVar11 = (pointer)local_80->_M_string_length;
      pbVar8 = local_80;
    } while (__pos < pGVar11);
    uVar14 = (ulong)uVar12;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_a0,pbVar8,(size_type)__pos,0xffffffffffffffff);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
             &local_a0);
  pbVar8 = local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = local_78.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p) !=
      &local_a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a0._M_dataplus._M_p._4_4_,(int)local_a0._M_dataplus._M_p),
                    CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                             local_a0.field_2._M_allocated_capacity._0_4_) + 1);
    pbVar8 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; pbVar9 = local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      bVar5 = pbVar8 != local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar6, bVar5; pbVar8 = pbVar8 + 1) {
    while (pbVar8->_M_string_length < uVar14) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (pbVar8," ");
    }
    pbVar6 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->lns,&local_78);
  pbVar9 = (this->lns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (this->lns).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar9) {
    local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->gts;
    local_38 = &this->phrs;
    local_40 = &this->nts;
    uVar14 = 0;
    do {
      if (pbVar9[uVar14]._M_string_length != 0) {
        uVar17 = 0;
        do {
          bVar3 = pbVar9[uVar14]._M_dataplus._M_p[uVar17];
          iVar15 = (int)uVar17;
          iVar13 = (int)uVar14;
          if (bVar3 < 0x3e) {
            if (bVar3 < 0x3a) {
              if (bVar3 == 0x2d) {
LAB_00104d79:
                local_a0._M_dataplus._M_p._0_4_ = iVar15;
                local_a0._M_dataplus._M_p._4_4_ = iVar13;
                std::vector<Wall,_std::allocator<Wall>_>::emplace_back<Wall>
                          (&this->wls,(Wall *)&local_a0);
              }
              else if (bVar3 == 0x2e) {
                local_a0._M_dataplus._M_p._0_4_ = iVar15;
                local_a0._M_dataplus._M_p._4_4_ = iVar13;
                std::vector<Pheromone,_std::allocator<Pheromone>_>::emplace_back<Pheromone>
                          (local_38,(Pheromone *)&local_a0);
              }
            }
            else if (bVar3 == 0x3a) {
              local_a0._M_dataplus._M_p._0_4_ = 0;
              __position._M_current =
                   (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              local_a0._M_dataplus._M_p._4_4_ = iVar15;
              local_a0._M_string_length._0_4_ = iVar13;
              local_a0._M_string_length._4_4_ = iVar15;
              local_a0.field_2._M_allocated_capacity._0_4_ = iVar13;
              if (__position._M_current ==
                  (this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Ant,_std::allocator<Ant>_>::_M_realloc_insert<Ant>
                          (local_40,__position,(Ant *)&local_a0);
              }
              else {
                ((__position._M_current)->t).y = iVar13;
                (__position._M_current)->direction = (int)(uVar17 << 0x20);
                (__position._M_current)->x = (int)((uVar17 << 0x20) >> 0x20);
                (__position._M_current)->y = iVar13;
                ((__position._M_current)->t).x = iVar15;
                ppAVar2 = &(this->nts).super__Vector_base<Ant,_std::allocator<Ant>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppAVar2 = *ppAVar2 + 1;
              }
            }
            else if (bVar3 == 0x3c) {
              local_a0._M_string_length._0_4_ = 0;
              __position_00._M_current =
                   (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position_00._M_current !=
                  (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00104dac;
              local_a0._M_dataplus._M_p._0_4_ = iVar15;
              local_a0._M_dataplus._M_p._4_4_ = iVar13;
              std::vector<Gate,_std::allocator<Gate>_>::_M_realloc_insert<Gate>
                        ((vector<Gate,_std::allocator<Gate>_> *)local_80,__position_00,
                         (Gate *)&local_a0);
            }
          }
          else if (bVar3 < 0x7c) {
            if (bVar3 == 0x3e) {
              local_a0._M_string_length._0_4_ = 2;
              __position_00._M_current =
                   (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                local_a0._M_dataplus._M_p._0_4_ = iVar15;
                local_a0._M_dataplus._M_p._4_4_ = iVar13;
                std::vector<Gate,_std::allocator<Gate>_>::_M_realloc_insert<Gate>
                          ((vector<Gate,_std::allocator<Gate>_> *)local_80,__position_00,
                           (Gate *)&local_a0);
              }
              else {
LAB_00104dac:
                (__position_00._M_current)->facing = (int)local_a0._M_string_length;
                (__position_00._M_current)->x = iVar15;
                (__position_00._M_current)->y = iVar13;
                ppGVar1 = &(this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppGVar1 = *ppGVar1 + 1;
                local_a0._M_dataplus._M_p._0_4_ = iVar15;
                local_a0._M_dataplus._M_p._4_4_ = iVar13;
              }
            }
            else if (bVar3 == 0x5e) {
              local_a0._M_string_length._0_4_ = 1;
              __position_00._M_current =
                   (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position_00._M_current !=
                  (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00104dac;
              local_a0._M_dataplus._M_p._0_4_ = iVar15;
              local_a0._M_dataplus._M_p._4_4_ = iVar13;
              std::vector<Gate,_std::allocator<Gate>_>::_M_realloc_insert<Gate>
                        ((vector<Gate,_std::allocator<Gate>_> *)local_80,__position_00,
                         (Gate *)&local_a0);
            }
          }
          else {
            if (bVar3 == 0x7c) goto LAB_00104d79;
            if (bVar3 == 0x7e) {
              local_a0._M_string_length._0_4_ = 3;
              __position_00._M_current =
                   (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position_00._M_current !=
                  (this->gts).super__Vector_base<Gate,_std::allocator<Gate>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_00104dac;
              local_a0._M_dataplus._M_p._0_4_ = iVar15;
              local_a0._M_dataplus._M_p._4_4_ = iVar13;
              std::vector<Gate,_std::allocator<Gate>_>::_M_realloc_insert<Gate>
                        ((vector<Gate,_std::allocator<Gate>_> *)local_80,__position_00,
                         (Gate *)&local_a0);
            }
          }
          uVar17 = uVar17 + 1;
          pbVar9 = (this->lns).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar17 < pbVar9[uVar14]._M_string_length);
        pbVar10 = (this->lns).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)pbVar10 - (long)pbVar9 >> 5));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return (ssize_t)this;
}

Assistant:

Reader& read(const string & text) {
            vector<string> lines;
            string::size_type pos;
            string::size_type prev = 0;
            int width = 0;

            string s;
            while ((pos = text.find('\n', prev)) != string::npos) {
                lines.push_back(s = text.substr(prev, pos - prev));
                int sz = (int)(s.size());
                width = max(sz, width);
                prev = pos + 1;
            } lines.push_back(text.substr(prev));

            for (auto & line : lines) while (line.size() < width)
                line.append(" ");

            this -> lns = lines;

            for (int y = 0; y < lns.size(); y++) for (int x = 0; x < lns[y].size(); x++) {
                char c = lns[y].at(x);
                if (c == ':')
                    nts.emplace_back(Ant(x, y));
                else if (c == '.')
                    phrs.emplace_back(Pheromone(x, y));
                else if (c == '-' || c == '|')
                    wls.emplace_back(Wall(x, y));
                else if (c == '>')
                    gts.emplace_back(Gate(x, y, 2));
                else if (c == '^')
                    gts.emplace_back(Gate(x, y, 1));
                else if (c == '<')
                    gts.emplace_back(Gate(x, y, 0));
                else if (c == '~')
                    gts.emplace_back(Gate(x, y, 3));
            }

            return *this;
        }